

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

Vec_Ptr_t * Aig_ManPartitionSmartRegisters(Aig_Man_t *pAig,int nSuppSizeLimit,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *vPartSuppsBit;
  void **ppvVar4;
  uint *__ptr;
  void *pvVar5;
  Vec_Ptr_t *vPartSuppsAll;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  uint *puVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  void **ppvVar14;
  size_t __nmemb;
  Vec_Ptr_t *pVVar15;
  int iVar16;
  Aig_Man_t *pAVar17;
  void **ppvVar18;
  ulong uVar19;
  size_t sVar20;
  timespec ts;
  Vec_Ptr_t local_80;
  int local_6c;
  Vec_Ptr_t *local_68;
  void **local_60;
  long local_58;
  Vec_Ptr_t *local_50;
  void **local_48;
  Vec_Ptr_t *local_40;
  void **local_38;
  
  local_6c = nSuppSizeLimit;
  iVar2 = clock_gettime(3,(timespec *)&local_80);
  if (iVar2 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_80.pArray),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_80._0_8_ * -1000000;
  }
  pAVar17 = pAig;
  local_68 = Aig_ManSupportsRegisters(pAig);
  iVar2 = (int)pAVar17;
  uVar3 = local_68->nSize;
  if (uVar3 != pAig->nRegs) {
    __assert_fail("Vec_PtrSize(vSupports) == Aig_ManRegNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                  ,0x336,"Vec_Ptr_t *Aig_ManPartitionSmartRegisters(Aig_Man_t *, int, int)");
  }
  if (0 < (int)uVar3) {
    ppvVar4 = local_68->pArray;
    uVar19 = 0;
    do {
      pVVar7 = (Vec_Int_t *)ppvVar4[uVar19];
      Vec_IntPush(pVVar7,(int)uVar19);
      iVar2 = (int)pVVar7;
      uVar19 = uVar19 + 1;
    } while (uVar3 != uVar19);
  }
  pVVar10 = local_68;
  if (fVerbose != 0) {
    Abc_Print(iVar2,"%s =","Supps");
    iVar16 = 3;
    iVar2 = clock_gettime(3,(timespec *)&local_80);
    if (iVar2 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = (long)local_80.pArray / 1000 + local_80._0_8_ * 1000000;
    }
    Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar12 + lVar11) / 1000000.0);
  }
  vPartSuppsBit = (Vec_Ptr_t *)malloc(0x10);
  vPartSuppsBit->nCap = 1000;
  vPartSuppsBit->nSize = 0;
  ppvVar4 = (void **)malloc(8000);
  vPartSuppsBit->pArray = ppvVar4;
  pVVar15 = &local_80;
  iVar2 = clock_gettime(3,(timespec *)pVVar15);
  if (iVar2 < 0) {
    local_58 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_80.pArray),8);
    local_58 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_80._0_8_ * -1000000;
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 0x100;
  __ptr[1] = 0;
  pvVar5 = malloc(0x800);
  *(void **)(__ptr + 2) = pvVar5;
  vPartSuppsAll = (Vec_Ptr_t *)malloc(0x10);
  vPartSuppsAll->nCap = 0x100;
  vPartSuppsAll->nSize = 0;
  ppvVar4 = (void **)malloc(0x800);
  vPartSuppsAll->pArray = ppvVar4;
  ppvVar4 = (void **)(long)pVVar10->nSize;
  local_50 = vPartSuppsAll;
  local_48 = ppvVar4;
  if (0 < (long)ppvVar4) {
    local_38 = pVVar10->pArray;
    ppvVar14 = (void **)0x0;
    local_40 = vPartSuppsBit;
    do {
      pVVar10 = (Vec_Ptr_t *)local_38[(long)ppvVar14];
      if (pVVar10->nSize < 1) goto LAB_00606a95;
      uVar3 = pVVar10->nSize - 1;
      pVVar10->nSize = uVar3;
      iVar2 = *(int *)((long)pVVar10->pArray + (ulong)uVar3 * 4);
      uVar3 = Aig_ManPartitionSmartFindPart
                        (vPartSuppsAll,pVVar15,vPartSuppsBit,local_6c,(Vec_Int_t *)pVVar10);
      local_60 = ppvVar14;
      if (uVar3 == 0xffffffff) {
        pVVar7 = (Vec_Int_t *)malloc(0x10);
        pVVar7->nCap = 0x20;
        pVVar7->nSize = 0;
        piVar8 = (int *)malloc(0x80);
        pVVar7->pArray = piVar8;
        Vec_IntPush(pVVar7,iVar2);
        piVar8 = (int *)malloc(0x10);
        iVar2 = pVVar10->nSize;
        lVar11 = (long)iVar2;
        piVar8[1] = iVar2;
        *piVar8 = iVar2;
        if (lVar11 == 0) {
          pvVar5 = (void *)0x0;
        }
        else {
          pvVar5 = malloc(lVar11 * 4);
        }
        *(void **)(piVar8 + 2) = pvVar5;
        memcpy(pvVar5,pVVar10->pArray,lVar11 << 2);
        uVar3 = __ptr[1];
        uVar1 = *__ptr;
        if (uVar3 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar5 = malloc(0x80);
            }
            else {
              pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar13 = 0x10;
          }
          else {
            uVar13 = uVar1 * 2;
            if ((int)uVar13 <= (int)uVar1) goto LAB_006065ee;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar5 = malloc((ulong)uVar1 << 4);
            }
            else {
              pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar1 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar5;
          *__ptr = uVar13;
        }
LAB_006065ee:
        vPartSuppsBit = local_40;
        __ptr[1] = uVar3 + 1;
        *(Vec_Int_t **)(*(long *)(__ptr + 2) + (long)(int)uVar3 * 8) = pVVar7;
        uVar3 = vPartSuppsAll->nSize;
        uVar1 = vPartSuppsAll->nCap;
        if (uVar3 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (vPartSuppsAll->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vPartSuppsAll->pArray,0x80);
            }
            iVar2 = 0x10;
          }
          else {
            iVar2 = uVar1 * 2;
            if (iVar2 <= (int)uVar1) goto LAB_00606664;
            if (vPartSuppsAll->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vPartSuppsAll->pArray,(ulong)uVar1 << 4);
            }
          }
          vPartSuppsAll->pArray = ppvVar4;
          vPartSuppsAll->nCap = iVar2;
        }
LAB_00606664:
        ppvVar4 = local_48;
        vPartSuppsAll->nSize = uVar3 + 1;
        vPartSuppsAll->pArray[(int)uVar3] = piVar8;
        pVVar15 = (Vec_Ptr_t *)((ulong)local_48 & 0xffffffff);
        puVar9 = Aig_ManSuppCharStart((Vec_Int_t *)pVVar10,(int)local_48);
        uVar3 = vPartSuppsBit->nSize;
        uVar1 = vPartSuppsBit->nCap;
        pVVar10 = pVVar15;
        if (uVar3 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (vPartSuppsBit->pArray == (void **)0x0) {
              ppvVar14 = (void **)malloc(0x80);
            }
            else {
              pVVar15 = (Vec_Ptr_t *)0x80;
              ppvVar14 = (void **)realloc(vPartSuppsBit->pArray,0x80);
            }
            iVar2 = 0x10;
          }
          else {
            iVar2 = uVar1 * 2;
            if (iVar2 <= (int)uVar1) goto LAB_006066e8;
            pVVar15 = (Vec_Ptr_t *)((ulong)uVar1 << 4);
            if (vPartSuppsBit->pArray == (void **)0x0) {
              ppvVar14 = (void **)malloc((size_t)pVVar15);
            }
            else {
              ppvVar14 = (void **)realloc(vPartSuppsBit->pArray,(size_t)pVVar15);
            }
          }
          vPartSuppsBit->pArray = ppvVar14;
          vPartSuppsBit->nCap = iVar2;
          pVVar10 = pVVar15;
        }
LAB_006066e8:
        vPartSuppsBit->nSize = uVar3 + 1;
        vPartSuppsBit->pArray[(int)uVar3] = puVar9;
      }
      else {
        uVar19 = (ulong)uVar3;
        if ((((int)uVar3 < 0) || ((int)__ptr[1] <= (int)uVar3)) ||
           (Vec_IntPush(*(Vec_Int_t **)(*(long *)(__ptr + 2) + uVar19 * 8),iVar2),
           vPartSuppsAll->nSize <= (int)uVar3)) goto LAB_00606a76;
        ppvVar14 = vPartSuppsAll->pArray;
        pVVar7 = (Vec_Int_t *)ppvVar14[uVar19];
        pVVar6 = Vec_IntTwoMerge(pVVar7,(Vec_Int_t *)pVVar10);
        if (pVVar7->pArray != (int *)0x0) {
          free(pVVar7->pArray);
          pVVar7->pArray = (int *)0x0;
        }
        if (pVVar7 != (Vec_Int_t *)0x0) {
          free(pVVar7);
        }
        vPartSuppsBit = local_40;
        ppvVar4 = local_48;
        ppvVar14[uVar19] = pVVar6;
        if (local_40->nSize <= (int)uVar3) goto LAB_00606a76;
        Aig_ManSuppCharAdd((uint *)local_40->pArray[uVar19],(Vec_Int_t *)pVVar10,(int)local_48);
        vPartSuppsAll = local_50;
      }
      ppvVar14 = (void **)((long)local_60 + 1);
      pVVar15 = pVVar10;
    } while (ppvVar4 != ppvVar14);
  }
  iVar2 = vPartSuppsBit->nSize;
  if (0 < (long)iVar2) {
    ppvVar14 = vPartSuppsBit->pArray;
    lVar11 = 0;
    do {
      if (ppvVar14[lVar11] != (void *)0x0) {
        free(ppvVar14[lVar11]);
      }
      lVar11 = lVar11 + 1;
    } while (iVar2 != lVar11);
  }
  if (vPartSuppsBit->pArray != (void **)0x0) {
    free(vPartSuppsBit->pArray);
    vPartSuppsBit->pArray = (void **)0x0;
  }
  free(vPartSuppsBit);
  if (fVerbose != 0) {
    Abc_Print((int)vPartSuppsBit,"%s =","Parts");
    iVar16 = 3;
    iVar2 = clock_gettime(3,(timespec *)&local_80);
    if (iVar2 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = (long)local_80.pArray / 1000 + local_80._0_8_ * 1000000;
    }
    Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar11 + local_58) / 1000000.0);
  }
  clock_gettime(3,(timespec *)&local_80);
  iVar2 = vPartSuppsAll->nSize;
  __nmemb = (size_t)iVar2;
  if (0 < (long)__nmemb) {
    ppvVar14 = vPartSuppsAll->pArray;
    sVar20 = 0;
    do {
      Vec_IntPush((Vec_Int_t *)ppvVar14[sVar20],(int)sVar20);
      sVar20 = sVar20 + 1;
    } while (__nmemb != sVar20);
  }
  local_60 = vPartSuppsAll->pArray;
  qsort(local_60,__nmemb,8,Vec_VecSortCompare2);
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 0x100;
  pVVar10->nSize = 0;
  ppvVar14 = (void **)malloc(0x800);
  pVVar10->pArray = ppvVar14;
  if (0 < iVar2) {
    sVar20 = 0;
    do {
      pvVar5 = local_60[sVar20];
      if (*(int *)((long)pvVar5 + 4) < 1) {
LAB_00606a95:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x396,"int Vec_IntPop(Vec_Int_t *)");
      }
      uVar3 = *(int *)((long)pvVar5 + 4) - 1;
      *(uint *)((long)pvVar5 + 4) = uVar3;
      iVar16 = *(int *)(*(long *)((long)pvVar5 + 8) + (ulong)uVar3 * 4);
      if (((long)iVar16 < 0) || ((int)__ptr[1] <= iVar16)) {
LAB_00606a76:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar5 = *(void **)(*(long *)(__ptr + 2) + (long)iVar16 * 8);
      uVar3 = pVVar10->nSize;
      uVar1 = pVVar10->nCap;
      if (uVar3 == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar10->pArray,0x80);
          }
          iVar16 = 0x10;
        }
        else {
          iVar16 = uVar1 * 2;
          if (iVar16 <= (int)uVar1) goto LAB_00606922;
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar10->pArray,(ulong)uVar1 << 4);
          }
        }
        pVVar10->pArray = ppvVar4;
        pVVar10->nCap = iVar16;
      }
LAB_00606922:
      pVVar10->nSize = uVar3 + 1;
      pVVar10->pArray[(int)uVar3] = pvVar5;
      sVar20 = sVar20 + 1;
      ppvVar4 = local_48;
      vPartSuppsAll = local_50;
    } while (__nmemb != sVar20);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  Aig_ManPartitionCompact(pVVar10,vPartSuppsAll,local_6c);
  if (fVerbose != 0) {
    printf("Created %d partitions.\n",(ulong)(uint)pVVar10->nSize);
  }
  if (0 < (int)ppvVar4) {
    ppvVar14 = local_68->pArray;
    ppvVar18 = (void **)0x0;
    do {
      pvVar5 = ppvVar14[(long)ppvVar18];
      if (pvVar5 != (void *)0x0) {
        if (*(void **)((long)pvVar5 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar5 + 8));
          *(undefined8 *)((long)pvVar5 + 8) = 0;
        }
        free(pvVar5);
      }
      ppvVar18 = (void **)((long)ppvVar18 + 1);
    } while (ppvVar4 != ppvVar18);
  }
  pVVar15 = local_68;
  if (local_68->pArray != (void **)0x0) {
    free(local_68->pArray);
    pVVar15->pArray = (void **)0x0;
  }
  ppvVar4 = local_60;
  if (pVVar15 != (Vec_Ptr_t *)0x0) {
    free(pVVar15);
  }
  pVVar15 = local_50;
  if (0 < iVar2) {
    sVar20 = 0;
    do {
      pvVar5 = ppvVar4[sVar20];
      if (pvVar5 != (void *)0x0) {
        if (*(void **)((long)pvVar5 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar5 + 8));
          *(undefined8 *)((long)pvVar5 + 8) = 0;
        }
        free(pvVar5);
      }
      sVar20 = sVar20 + 1;
    } while (__nmemb != sVar20);
  }
  if (ppvVar4 != (void **)0x0) {
    free(ppvVar4);
    pVVar15->pArray = (void **)0x0;
  }
  free(pVVar15);
  return pVVar10;
}

Assistant:

Vec_Ptr_t * Aig_ManPartitionSmartRegisters( Aig_Man_t * pAig, int nSuppSizeLimit, int fVerbose )
{
    Vec_Ptr_t * vPartSuppsBit;
    Vec_Ptr_t * vSupports, * vPartsAll, * vPartsAll2, * vPartSuppsAll;
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart, iOut;
    abctime clk;

    // add output number to each
clk = Abc_Clock();
    vSupports = Aig_ManSupportsRegisters( pAig );
    assert( Vec_PtrSize(vSupports) == Aig_ManRegNum(pAig) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vOne, i )
        Vec_IntPush( vOne, i );
if ( fVerbose )
{
ABC_PRT( "Supps", Abc_Clock() - clk );
}

    // start char-based support representation
    vPartSuppsBit = Vec_PtrAlloc( 1000 );

    // create partitions
clk = Abc_Clock();
    vPartsAll = Vec_PtrAlloc( 256 );
    vPartSuppsAll = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vOne, i )
    {
        // get the output number
        iOut = Vec_IntPop(vOne);
        // find closely matching part
        iPart = Aig_ManPartitionSmartFindPart( vPartSuppsAll, vPartsAll, vPartSuppsBit, nSuppSizeLimit, vOne );
        if ( iPart == -1 )
        {
            // create new partition
            vPart = Vec_IntAlloc( 32 );
            Vec_IntPush( vPart, iOut );
            // create new partition support
            vPartSupp = Vec_IntDup( vOne );
            // add this partition and its support
            Vec_PtrPush( vPartsAll, vPart );
            Vec_PtrPush( vPartSuppsAll, vPartSupp );

            Vec_PtrPush( vPartSuppsBit, Aig_ManSuppCharStart(vOne, Vec_PtrSize(vSupports)) );
        }
        else
        {
            // add output to this partition
            vPart = (Vec_Int_t *)Vec_PtrEntry( vPartsAll, iPart );
            Vec_IntPush( vPart, iOut );
            // merge supports
            vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSuppsAll, iPart );
            vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
            Vec_IntFree( vTemp );
            // reinsert new support
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );

            Aig_ManSuppCharAdd( (unsigned *)Vec_PtrEntry(vPartSuppsBit, iPart), vOne, Vec_PtrSize(vSupports) );
        }
    }

    // stop char-based support representation
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsBit, vTemp, i )
        ABC_FREE( vTemp );
    Vec_PtrFree( vPartSuppsBit );

//printf( "\n" );
if ( fVerbose )
{
ABC_PRT( "Parts", Abc_Clock() - clk );
}

clk = Abc_Clock();
    // reorder partitions in the decreasing order of support sizes
    // remember partition number in each partition support
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_IntPush( vOne, i );
    // sort the supports in the decreasing order
    Vec_VecSort( (Vec_Vec_t *)vPartSuppsAll, 1 );
    // reproduce partitions
    vPartsAll2 = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_PtrPush( vPartsAll2, Vec_PtrEntry(vPartsAll, Vec_IntPop(vOne)) );
    Vec_PtrFree( vPartsAll );
    vPartsAll = vPartsAll2;

    // compact small partitions
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    Aig_ManPartitionCompact( vPartsAll, vPartSuppsAll, nSuppSizeLimit );
    if ( fVerbose )
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    printf( "Created %d partitions.\n", Vec_PtrSize(vPartsAll) );

if ( fVerbose )
{
//ABC_PRT( "Comps", Abc_Clock() - clk );
}

    // cleanup
    Vec_VecFree( (Vec_Vec_t *)vSupports );
//    if ( pvPartSupps == NULL )
        Vec_VecFree( (Vec_Vec_t *)vPartSuppsAll );
//    else
//        *pvPartSupps = vPartSuppsAll;

/*
    // converts from intergers to nodes
    Vec_PtrForEachEntry( Vec_Int_t *, vPartsAll, vPart, iPart )
    {
        vPartPtr = Vec_PtrAlloc( Vec_IntSize(vPart) );
        Vec_IntForEachEntry( vPart, iOut, i )
            Vec_PtrPush( vPartPtr, Aig_ManCo(p, iOut) );
        Vec_IntFree( vPart );
        Vec_PtrWriteEntry( vPartsAll, iPart, vPartPtr );
    }
*/
    return vPartsAll;
}